

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ClockingItemSyntax::ClockingItemSyntax
          (ClockingItemSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          ClockingDirectionSyntax *direction,
          SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *decls,Token semi)

{
  bool bVar1;
  ClockingDirectionSyntax *pCVar2;
  AttributeSpecSyntax *pAVar3;
  AttributeSpecSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *local_38;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *decls_local;
  ClockingDirectionSyntax *direction_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  ClockingItemSyntax *this_local;
  Token semi_local;
  
  semi_local._0_8_ = semi.info;
  this_local = semi._0_8_;
  local_38 = decls;
  decls_local = (SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)direction;
  direction_local = (ClockingDirectionSyntax *)attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ClockingItem,attributes);
  __range2 = decls_local;
  not_null<slang::syntax::ClockingDirectionSyntax*>::
  not_null<slang::syntax::ClockingDirectionSyntax*,void>
            ((not_null<slang::syntax::ClockingDirectionSyntax*> *)&this->direction,
             (ClockingDirectionSyntax **)&__range2);
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::SeparatedSyntaxList
            (&this->decls,local_38);
  *(ClockingItemSyntax **)&this->semi = this_local;
  (this->semi).info = (Info *)semi_local._0_8_;
  pCVar2 = not_null<slang::syntax::ClockingDirectionSyntax_*>::operator->(&this->direction);
  (pCVar2->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->decls).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::begin(&this->decls);
  _child = SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::end(&this->decls);
  while( true ) {
    bVar1 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<slang::syntax::AttributeSpecSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::AttributeSpecSyntax_*,_unsigned_long,_slang::syntax::AttributeSpecSyntax_**,_slang::syntax::AttributeSpecSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<slang::syntax::AttributeSpecSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::AttributeSpecSyntax_*,_unsigned_long,_slang::syntax::AttributeSpecSyntax_**,_slang::syntax::AttributeSpecSyntax_*&>
                          *)&__end2.index,
                         (iterator_base<slang::syntax::AttributeSpecSyntax_*> *)&child);
    if (!bVar1) break;
    pAVar3 = SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::
             iterator_base<slang::syntax::AttributeSpecSyntax_*>::operator*
                       ((iterator_base<slang::syntax::AttributeSpecSyntax_*> *)&__end2.index);
    (pAVar3->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<slang::syntax::AttributeSpecSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::AttributeSpecSyntax_*,_unsigned_long,_slang::syntax::AttributeSpecSyntax_**,_slang::syntax::AttributeSpecSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<slang::syntax::AttributeSpecSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::AttributeSpecSyntax_*,_unsigned_long,_slang::syntax::AttributeSpecSyntax_**,_slang::syntax::AttributeSpecSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

ClockingItemSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, ClockingDirectionSyntax& direction, const SeparatedSyntaxList<AttributeSpecSyntax>& decls, Token semi) :
        MemberSyntax(SyntaxKind::ClockingItem, attributes), direction(&direction), decls(decls), semi(semi) {
        this->direction->parent = this;
        this->decls.parent = this;
        for (auto child : this->decls)
            child->parent = this;
    }